

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void handleSelection(char type,int selection)

{
  long lVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if ((type & 0xdfU) == 0x44) {
    switch(selection + -1) {
    case 0:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"/* #1 Removal of Trigraphs */",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp.";
      lVar1 = 0x4c;
      break;
    case 1:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/* #2 Removal of deprecated Increment Operator(++) for bool type */",0x43);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp.";
      lVar1 = 0x4d;
      break;
    case 2:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"/* #3 Removal of deprecated register keyword */",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp.";
      lVar1 = 0x4b;
      break;
    case 3:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/* #4 Removal of deprecated Dynamic Exception Specifications */",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp.";
      lVar1 = 0x4f;
      break;
    default:
      goto switchD_00102aae_default;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Compile against -std=c++14 to build.",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    return;
  }
  switch(selection + -1) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #1 Addition of __has_include macro */",0x28);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"new/1/hasinclude","");
    runNix(&local_30);
    local_430.field_2._M_allocated_capacity = local_30.field_2._M_allocated_capacity;
    _Var3._M_p = local_30._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return;
    }
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #2 UTF 8 Character Literals */",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp.",0x3f);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"new/2/utf8","");
    runNix(&local_50);
    local_430.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var3._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #3 Hexadecimal Floating Point Literals */",0x2c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp.",0x3e);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"new/3/hex","");
    runNix(&local_70);
    local_430.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var3._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    break;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/* #4 New rules for deduction of single member list using auto */",0x41);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"new/4/auto_deduc","");
    runNix(&local_90);
    local_430.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    _Var3._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #5 Update to __cplusplus value */",0x24);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp.",0x40);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"new/5/cppvc","");
    runNix(&local_b0);
    local_430.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var3._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    break;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #6 Inline variables */",0x19);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp.",0x41);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"new/6/inline","");
    runNix(&local_d0);
    local_430.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    _Var3._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return;
    }
    break;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #7 New Syntax for Nested Namespace definitions */",0x34);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp.",0x44);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"new/7/namespace","");
    runNix(&local_f0);
    local_430.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var3._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return;
    }
    break;
  case 7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #8  Initializers added to if/switch statements */",0x34);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"new/8/init_if_sw","");
    runNix(&local_110);
    local_430.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    _Var3._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return;
    }
    break;
  case 8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #9 constexpr if */",0x15);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp.",0x47);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"new/9/constexpr_if","");
    runNix(&local_130);
    local_430.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    _Var3._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      return;
    }
    break;
  case 9:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */"
               ,0x53);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"new/10/attributes","");
    runNix(&local_150);
    local_430.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
    _Var3._M_p = local_150._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) {
      return;
    }
    break;
  case 10:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #11 Attributes for Enumerator & Namespaces */",0x30);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp.",0x47);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"new/11/attributes2","");
    runNix(&local_170);
    local_430.field_2._M_allocated_capacity = local_170.field_2._M_allocated_capacity;
    _Var3._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) {
      return;
    }
    break;
  case 0xb:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #12 Error message for static_assert now optional */",0x36);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp.",0x49);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"new/12/static_assert","");
    runNix(&local_190);
    local_430.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
    _Var3._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) {
      return;
    }
    break;
  case 0xc:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #13 Structured binding declarations */",0x29);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"new/134/tuple_pack","");
    runNix(&local_1b0);
    local_430.field_2._M_allocated_capacity = local_1b0.field_2._M_allocated_capacity;
    _Var3._M_p = local_1b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) {
      return;
    }
    break;
  case 0xd:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_2d96,0x5c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp.",0x47);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"new/14/templ_param","");
    runNix(&local_1d0);
    local_430.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    _Var3._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
      return;
    }
    break;
  case 0xe:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #15 Constant evaluation for non-type template arguments */"
               ,0x3d);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp.",0x49);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"new/15/const_nontype","");
    runNix(&local_1f0);
    local_430.field_2._M_allocated_capacity = local_1f0.field_2._M_allocated_capacity;
    _Var3._M_p = local_1f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
      return;
    }
    break;
  case 0xf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #16 Class template argument deduction */",0x2b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp.",0x4a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"new/16/temp_arg_deduc","")
    ;
    runNix(&local_210);
    local_430.field_2._M_allocated_capacity = local_210.field_2._M_allocated_capacity;
    _Var3._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) {
      return;
    }
    break;
  case 0x10:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #17 Extensions on over-aligned Memory Allocation */",0x36);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"new/17/over_align","");
    runNix(&local_230);
    local_430.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
    _Var3._M_p = local_230._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p == &local_230.field_2) {
      return;
    }
    break;
  case 0x11:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #18 Fold Expressions */",0x1a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"new/18/fold_expr","");
    runNix(&local_250);
    local_430.field_2._M_allocated_capacity = local_250.field_2._M_allocated_capacity;
    _Var3._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) {
      return;
    }
    break;
  case 0x12:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #19 List-style Initialization of Enumerations */",0x33);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"new/19/enum_list","");
    runNix(&local_270);
    local_430.field_2._M_allocated_capacity = local_270.field_2._M_allocated_capacity;
    _Var3._M_p = local_270._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == &local_270.field_2) {
      return;
    }
    break;
  case 0x13:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #20 Specifying non-type template parameters with auto */",
               0x3b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"new/20/auto_temp","");
    runNix(&local_290);
    local_430.field_2._M_allocated_capacity = local_290.field_2._M_allocated_capacity;
    _Var3._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == &local_290.field_2) {
      return;
    }
    break;
  case 0x14:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #21  constexpr lambda expressions */",0x27);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp.",0x4c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"new/21/constexpr_lambda","");
    runNix(&local_2b0);
    local_430.field_2._M_allocated_capacity = local_2b0.field_2._M_allocated_capacity;
    _Var3._M_p = local_2b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) {
      return;
    }
    break;
  case 0x15:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #22 Lambda this by value (*this) */",0x26);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp.",0x47);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"new/22/lambda_this","");
    runNix(&local_2d0);
    local_430.field_2._M_allocated_capacity = local_2d0.field_2._M_allocated_capacity;
    _Var3._M_p = local_2d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) {
      return;
    }
    break;
  case 0x16:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #23 Extending Aggregate Initialization to Base Types */",
               0x3a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"new/23/aggregate","");
    runNix(&local_2f0);
    local_430.field_2._M_allocated_capacity = local_2f0.field_2._M_allocated_capacity;
    _Var3._M_p = local_2f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) {
      return;
    }
    break;
  case 0x17:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #24 Unknown Attributes Required to be Ignored */",0x33);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"new/24/unknw_attr","");
    runNix(&local_310);
    local_430.field_2._M_allocated_capacity = local_310.field_2._M_allocated_capacity;
    _Var3._M_p = local_310._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p == &local_310.field_2) {
      return;
    }
    break;
  case 0x18:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #25 Pack Expansions legal in using declarations */",0x35);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"new/25/using_pack","");
    runNix(&local_330);
    local_430.field_2._M_allocated_capacity = local_330.field_2._M_allocated_capacity;
    _Var3._M_p = local_330._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p == &local_330.field_2) {
      return;
    }
    break;
  case 0x19:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #26 Generalization of Range-based for loop */",0x30);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp.",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"new/26/range_for","");
    runNix(&local_350);
    local_430.field_2._M_allocated_capacity = local_350.field_2._M_allocated_capacity;
    _Var3._M_p = local_350._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p == &local_350.field_2) {
      return;
    }
    break;
  case 0x1a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #27 The byte data type */",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp.",0x40);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"new/27/byte","");
    runNix(&local_370);
    local_430.field_2._M_allocated_capacity = local_370.field_2._M_allocated_capacity;
    _Var3._M_p = local_370._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p == &local_370.field_2) {
      return;
    }
    break;
  case 0x1b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #28 Using attribute namespaces without repetition */",0x37)
    ;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"new/28/using_attr","");
    runNix(&local_390);
    local_430.field_2._M_allocated_capacity = local_390.field_2._M_allocated_capacity;
    _Var3._M_p = local_390._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p == &local_390.field_2) {
      return;
    }
    break;
  case 0x1c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #29 Stricter Order of Evaluation Rules */",0x2c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt.",0x4c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"new/29/eval_order.txt","")
    ;
    runNix(&local_3b0);
    local_430.field_2._M_allocated_capacity = local_3b0.field_2._M_allocated_capacity;
    _Var3._M_p = local_3b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p == &local_3b0.field_2) {
      return;
    }
    break;
  case 0x1d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/* #30 Exception Specifications are part of type definitions */",0x3f);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp.",0x46);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"new/30/throw_type","");
    runNix(&local_3d0);
    local_430.field_2._M_allocated_capacity = local_3d0.field_2._M_allocated_capacity;
    _Var3._M_p = local_3d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p == &local_3d0.field_2) {
      return;
    }
    break;
  case 0x1e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/* #31 Template-Template Parameters match compatible arguments */",0x41);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp.",0x47);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"new/31/templ_match","");
    runNix(&local_3f0);
    local_430.field_2._M_allocated_capacity = local_3f0.field_2._M_allocated_capacity;
    _Var3._M_p = local_3f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p == &local_3f0.field_2) {
      return;
    }
    break;
  case 0x1f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #31 Guaranteed Copy Elision */",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt",0x4b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"new/32/templ_match.txt","");
    runNix(&local_410);
    local_430.field_2._M_allocated_capacity = local_410.field_2._M_allocated_capacity;
    _Var3._M_p = local_410._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p == &local_410.field_2) {
      return;
    }
    break;
  case 0x20:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/* #33 Changes to Specification on Inheriting Constructors */"
               ,0x3d);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp",0x4c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (isWindows != false) {
      return;
    }
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"new/33/using_constr","");
    runNix(&local_430);
    _Var3._M_p = local_430._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p == &local_430.field_2) {
      return;
    }
    break;
  default:
    goto switchD_00102aae_default;
  }
  operator_delete(_Var3._M_p,local_430.field_2._M_allocated_capacity + 1);
switchD_00102aae_default:
  return;
}

Assistant:

void handleSelection (char type, int selection) {
	//Old Language Features
	if (type == 'D' || type == 'd' ){
		switch (selection) {
			case 1:
				cout << "/* #1 Removal of Trigraphs */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 2:
				cout << "/* #2 Removal of deprecated Increment Operator(++) for bool type */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 3:
				cout << "/* #3 Removal of deprecated register keyword */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;				
				break;
			case 4:
				cout << "/* #4 Removal of deprecated Dynamic Exception Specifications */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
		}
	}
	//New Language Features
	else {
		switch(selection){
			case 1:
				cout << "/* #1 Addition of __has_include macro */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp." << endl;
				if (isWindows)
					runWin32Process("new/1/hasinclude");
				else
					runNix("new/1/hasinclude");
				break;
			case 2:
				cout << "/* #2 UTF 8 Character Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp." << endl;
				if (isWindows)
					runWin32Process("new/2/utf8");
				else
					runNix("new/2/utf8");
				break;
			case 3:
				cout << "/* #3 Hexadecimal Floating Point Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp." << endl;
				if (isWindows)
					runWin32Process("new/3/hex");
				else
					runNix("new/3/hex");
				break;
			case 4:
				cout << "/* #4 New rules for deduction of single member list using auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/4/auto_deduc");
				else
					runNix("new/4/auto_deduc");
				break;
			case 5:
				cout << "/* #5 Update to __cplusplus value */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/5/cppvc");
				else
					runNix("new/5/cppvc");
				break;
			case 6:
				cout << "/* #6 Inline variables */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp." << endl;
				if (isWindows)
					runWin32Process("new/6/inline");
				else
					runNix("new/6/inline");
				break;
			case 7:
				cout << "/* #7 New Syntax for Nested Namespace definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp." << endl;
				if (isWindows)
					runWin32Process("new/7/namespace");
				else
					runNix("new/7/namespace");
				break;
			case 8:
				cout << "/* #8  Initializers added to if/switch statements */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp." << endl;
				if (isWindows)
					runWin32Process("new/8/init_if_sw");
				else
					runNix("new/8/init_if_sw");
				break;
			case 9:
				cout << "/* #9 constexpr if */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp." << endl;
				if (isWindows)
					runWin32Process("new/9/constexpr_if");
				else
					runNix("new/9/constexpr_if");
				break;
			case 10:
				cout << "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp." << endl;
				if (isWindows)
					runWin32Process("new/10/attributes");
				else
					runNix("new/10/attributes");
				break;
			case 11:
				cout << "/* #11 Attributes for Enumerator & Namespaces */"<< endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp." << endl;
				if (isWindows)
					runWin32Process("new/11/attributes2");
				else
					runNix("new/11/attributes2");
				break;
			case 12:
				cout << "/* #12 Error message for static_assert now optional */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp." << endl;
				if (isWindows)
					runWin32Process("new/12/static_assert");
				else
					runNix("new/12/static_assert");
				break;
			case 13:
				cout << "/* #13 Structured binding declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/13/tuple_pack");
				else
					runNix("new/134/tuple_pack");
				break;
			case 14:
				cout << "/* #14 Keyword typename now allowed in lieu of class in a template’s template paramater */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp." << endl;
				if (isWindows)
					runWin32Process("new/14/templ_param");
				else
					runNix("new/14/templ_param");
				break;
			case 15:
				cout << "/* #15 Constant evaluation for non-type template arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp." << endl;
				if (isWindows)
					runWin32Process("new/15/const_nontype");
				else
					runNix("new/15/const_nontype");
				break;
			case 16:
				cout << "/* #16 Class template argument deduction */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/16/temp_arg_deduc");
				else
					runNix("new/16/temp_arg_deduc");
				break;
			case 17:
				cout << "/* #17 Extensions on over-aligned Memory Allocation */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp." << endl;
				if (isWindows)
					runWin32Process("new/17/over_align");
				else
					runNix("new/17/over_align");
				break;
			case 18:
				cout << "/* #18 Fold Expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/18/fold_expr");
				else
					runNix("new/18/fold_expr");
				break;
			case 19:
				cout << "/* #19 List-style Initialization of Enumerations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp." << endl;
				if (isWindows)
					runWin32Process("new/19/enum_list");
				else
					runNix("new/19/enum_list");
				break;
			case 20:
				cout << "/* #20 Specifying non-type template parameters with auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp." << endl;
				if (isWindows)
					runWin32Process("new/20/auto_temp");
				else
					runNix("new/20/auto_temp");
				break;
			case 21:
				cout << "/* #21  constexpr lambda expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp." << endl;
				if (isWindows)
					runWin32Process("new/21/constexpr_lambda");
				else
					runNix("new/21/constexpr_lambda");
				break;
			case 22:
				cout << "/* #22 Lambda this by value (*this) */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp." << endl;
				if (isWindows)
					runWin32Process("new/22/lambda_this");
				else
					runNix("new/22/lambda_this");
				break;
			case 23:
				cout << "/* #23 Extending Aggregate Initialization to Base Types */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp." << endl;
				if (isWindows)
					runWin32Process("new/23/aggregate");
				else
					runNix("new/23/aggregate");
				break;
			case 24:
				cout << "/* #24 Unknown Attributes Required to be Ignored */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/24/unknw_attr");
				else
					runNix("new/24/unknw_attr");
				break;
			case 25:
				cout << "/* #25 Pack Expansions legal in using declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/25/using_pack");
				else
					runNix("new/25/using_pack");
				break;
			case 26:
				cout << "/* #26 Generalization of Range-based for loop */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp." << endl;
				if (isWindows)
					runWin32Process("new/26/range_for");
				else
					runNix("new/26/range_for");
				break;
			case 27:
				cout << "/* #27 The byte data type */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp." << endl;
				if (isWindows)
					runWin32Process("new/27/byte");
				else
					runNix("new/27/byte");
				break;
			case 28:
				cout << "/* #28 Using attribute namespaces without repetition */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/28/using_attr");
				else
					runNix("new/28/using_attr");
				break;
			case 29:
				cout << "/* #29 Stricter Order of Evaluation Rules */" << endl;
				cout << "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt." << endl;
				if (isWindows)
					runWin32Process("new/29/eval_order.txt");
				else
					runNix("new/29/eval_order.txt");
				break;
			case 30:
				cout << "/* #30 Exception Specifications are part of type definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp." << endl;
				if (isWindows)
					runWin32Process("new/30/throw_type");
				else
					runNix("new/30/throw_type");
				break;
			case 31:
				cout << "/* #31 Template-Template Parameters match compatible arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp." << endl;
				if (isWindows)
					runWin32Process("new/31/templ_match");
				else
					runNix("new/31/templ_match");
				break;
			case 32:
				cout << "/* #31 Guaranteed Copy Elision */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt" << endl;
				if (isWindows)
					runWin32Process("new/32/templ_match.txt");
				else
					runNix("new/32/templ_match.txt");
				break;
			case 33:
				cout << "/* #33 Changes to Specification on Inheriting Constructors */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp" << endl;
				if (isWindows)
					runWin32Process("new/33/using_constr");
				else
					runNix("new/33/using_constr");
				break;
		}
	}
}